

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O3

void __thiscall
__gnu_cxx::new_allocator<Assimp::AC3DImporter::Material>::
construct<Assimp::AC3DImporter::Material,Assimp::AC3DImporter::Material>
          (new_allocator<Assimp::AC3DImporter::Material> *this,Material *__p,Material *__args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  float fVar5;
  
  (__p->rgb).r = (__args->rgb).r;
  (__p->rgb).g = (__args->rgb).g;
  (__p->rgb).b = (__args->rgb).b;
  (__p->amb).r = (__args->amb).r;
  (__p->amb).g = (__args->amb).g;
  (__p->amb).b = (__args->amb).b;
  (__p->emis).r = (__args->emis).r;
  (__p->emis).g = (__args->emis).g;
  (__p->emis).b = (__args->emis).b;
  (__p->spec).r = (__args->spec).r;
  (__p->spec).g = (__args->spec).g;
  (__p->spec).b = (__args->spec).b;
  fVar5 = __args->trans;
  __p->shin = __args->shin;
  __p->trans = fVar5;
  paVar1 = &(__p->name).field_2;
  (__p->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (__args->name)._M_dataplus._M_p;
  paVar2 = &(__args->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(__args->name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__p->name).field_2 + 8) = uVar4;
  }
  else {
    (__p->name)._M_dataplus._M_p = pcVar3;
    (__p->name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__p->name)._M_string_length = (__args->name)._M_string_length;
  (__args->name)._M_dataplus._M_p = (pointer)paVar2;
  (__args->name)._M_string_length = 0;
  (__args->name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

aiColor3D (const aiColor3D& o) : r(o.r), g(o.g), b(o.b) {}